

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O3

_Bool pyramid_isWon(Board *board)

{
  Spot *pSVar1;
  uchar spotIndex;
  _Bool _Var2;
  
  spotIndex = '\0';
  do {
    pSVar1 = board_spotGet(board,TABLEAU,spotIndex);
    if (pSVar1->cardsCount != '\0') {
      return false;
    }
    spotIndex = spotIndex + '\x01';
  } while (spotIndex != '\x1c');
  _Var2 = true;
  if (((gConfig.game)->id & ~BAKERSGAME) != PYRAMIDRELAXED) {
    pSVar1 = board_spotGet(board,FOUNDATION,'\0');
    _Var2 = pSVar1->cardsCount == '4';
  }
  return _Var2;
}

Assistant:

bool pyramid_isWon(Board * board)
{
	unsigned char i;
	for(i=0;i<28;i++)
	{
		if(board_spotGet(board, TABLEAU, i)->cardsCount!=0)
			return false;
	}

	if(gConfig.game->id==PYRAMIDRELAXED || gConfig.game->id==PYRAMIDRELAXEDEASY)
		return true;

	return board_spotGet(board, FOUNDATION, 0)->cardsCount==52;
}